

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void add_linear_comb_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *res,double *Xc,
               unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *coef,double x_sd,double x_mean
               ,double *fill_val,MissingAction missing_action,double *buffer_arr,size_t *buffer_NAs,
               bool first_run,vector<double,_std::allocator<double>_> *w)

{
  long lVar1;
  unsigned_long uVar2;
  pointer pdVar3;
  pointer puVar4;
  size_t sVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  double *pdVar6;
  double *__n;
  longdouble in_ST0;
  double dVar7;
  allocator_type local_101;
  double *local_100;
  size_t local_f8;
  ulong local_f0;
  double *local_e8;
  double *local_e0;
  longdouble local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  vector<double,_std::allocator<double>_> obs_weight;
  vector<double,_std::allocator<double>_> denseX;
  
  local_f0 = (ulong)missing_action;
  if (missing_action == Fail || !first_run) {
    add_linear_comb<double,unsigned_long>
              (ix_arr,st,end,col_num,res,Xc,Xc_ind,Xc_indptr,coef,x_sd,x_mean,fill_val,
               missing_action,buffer_arr,buffer_NAs,first_run);
    return;
  }
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,w);
  local_100 = coef;
  pdVar6 = (double *)((end - st) + 1);
  obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8 = res;
  std::vector<double,_std::allocator<double>_>::vector
            (&denseX,(size_type)pdVar6,(value_type_conflict *)&obs_weight,
             (allocator_type *)&sorted_ix);
  local_f8 = col_num;
  local_e0 = Xc;
  todense<double,unsigned_long>
            (ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,
             denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector
            (&obs_weight,(size_type)pdVar6,(allocator_type *)&sorted_ix);
  lVar1 = *local_d8._0_8_;
  pdVar3 = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar5 = st; sVar5 <= end; sVar5 = sVar5 + 1) {
    *pdVar3 = *(double *)(lVar1 + ix_arr[sVar5] * 8);
    pdVar3 = pdVar3 + 1;
  }
  __n = pdVar6;
  for (__last._M_current = (double *)0x0; pdVar6 != __last._M_current;
      __last._M_current = __last._M_current + 1) {
    dVar7 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(long)__last._M_current];
    if (0x7fefffffffffffff < (ulong)ABS(dVar7)) {
      denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[__last._M_current] =
           denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[(long)__n + -1];
      denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)__n + -1] = dVar7;
      dVar7 = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(long)__last._M_current];
      obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[__last._M_current] =
           obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[(long)__n + -1];
      obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[(long)__n + -1] = dVar7;
      __n = (double *)((long)__n + -1);
    }
  }
  local_d8 = (longdouble)0;
  std::
  accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long_double>
            ((longdouble *)
             obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + __n),__last,local_d8);
  in_ST0 = in_ST0 * (longdouble)0.5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&sorted_ix,(size_type)__n,&local_101);
  uVar2 = 0;
  for (puVar4 = sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar4 != sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    *puVar4 = uVar2;
    uVar2 = uVar2 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,unsigned_long,double*,double_const*,unsigned_long_const*,unsigned_long_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:906:19)>
              )&denseX);
  dVar7 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start[sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1]];
  *fill_val = dVar7;
  pdVar6 = (double *)0x0;
  do {
    if (__n == pdVar6) {
LAB_00221172:
      *fill_val = (*local_100 / x_sd) * (dVar7 - x_mean);
      if (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_finish !=
          denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start) {
        denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      add_linear_comb<double,unsigned_long>
                (ix_arr,st,end,local_f8,local_e8,local_e0,Xc_ind,Xc_indptr,local_100,x_sd,x_mean,
                 fill_val,(MissingAction)local_f0,buffer_arr,buffer_NAs,false);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&obs_weight.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&denseX.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    local_d8 = local_d8 +
               (longdouble)
               obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start
               [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pdVar6]];
    if (in_ST0 <= local_d8) {
      dVar7 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pdVar6]];
      if (((local_d8 == in_ST0) && (!NAN(local_d8) && !NAN(in_ST0))) &&
         (pdVar6 < (double *)((long)__n + -1))) {
        dVar7 = dVar7 + (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [sorted_ix.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pdVar6 + 1]] - dVar7) * 0.5;
      }
      *fill_val = dVar7;
      goto LAB_00221172;
    }
    pdVar6 = (double *)((long)pdVar6 + 1);
  } while( true );
}

Assistant:

void add_linear_comb_weighted(const size_t *restrict ix_arr, size_t st, size_t end, size_t col_num, double *restrict res,
                              const real_t_ *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                              double &restrict coef, double x_sd, double x_mean, double &restrict fill_val, MissingAction missing_action,
                              double *restrict buffer_arr, size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: there's likely a better way of doing this directly with sparse inputs.
       Think about some way of doing it efficiently. */
    if (first_run && missing_action != Fail)
    {
        std::vector<double> denseX(end-st+1, 0.);
        todense(ix_arr, st, end,
                col_num, Xc, Xc_ind, Xc_indptr,
                denseX.data());
        std::vector<double> obs_weight(end-st+1);
        for (size_t row = st; row <= end; row++)
            obs_weight[row - st] = w[ix_arr[row]];

        size_t end_new = end - st + 1;
        for (size_t ix = 0; ix < end-st+1; ix++)
        {
            if (unlikely(is_na_or_inf(denseX[ix])))
            {
                std::swap(denseX[ix], denseX[--end_new]);
                std::swap(obs_weight[ix], obs_weight[end_new]);
            }
        }

        ldouble_safe cumw = std::accumulate(obs_weight.begin(), obs_weight.begin() + end_new, (ldouble_safe)0);
        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(end_new);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&denseX](const size_t a, const size_t b){return denseX[a] < denseX[b];});
        ldouble_safe currw = 0;
        fill_val = denseX[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < end_new; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < end_new-1)
                    fill_val = denseX[sorted_ix[ix]] + (denseX[sorted_ix[ix+1]] - denseX[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = denseX[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * (coef / x_sd);
        denseX.clear();
        obs_weight.clear();
        sorted_ix.clear();
        
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, false);
    }

    else
    {
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, first_run);
    }
}